

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.h
# Opt level: O0

void __thiscall AST::WhileStmt::~WhileStmt(WhileStmt *this)

{
  WhileStmt *this_local;
  
  ~WhileStmt(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

explicit WhileStmt(std::unique_ptr<Expr> condition, std::unique_ptr<BlockStmt> body)
        : m_condition(std::move(condition))
        , m_body(std::move(body)) { }